

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darLib.c
# Opt level: O2

void Dar_LibEvalAssignNums(Dar_Man_t *p,int Class,Aig_Obj_t *pRoot)

{
  int iVar1;
  Dar_LibObj_t *pDVar2;
  Dar_LibObj_t DVar3;
  Dar_LibDat_t *pDVar4;
  Aig_Obj_t *pAVar5;
  Aig_Man_t *pAVar6;
  Dar_Lib_t *pDVar7;
  anon_union_4_2_947302e2 v;
  float fVar8;
  Aig_Obj_t *pAVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  long lVar15;
  Dar_LibDat_t *pDVar16;
  
  lVar15 = 0;
  while( true ) {
    pDVar7 = s_DarLib;
    if (s_DarLib->nNodes0[Class] <= lVar15) {
      return;
    }
    iVar1 = s_DarLib->pNodes0[Class][lVar15];
    pDVar2 = s_DarLib->pObjs;
    uVar11 = (int)lVar15 + 4U & 0xfffffff;
    uVar10 = (ulong)uVar11;
    pDVar2[iVar1] = (Dar_LibObj_t)((ulong)pDVar2[iVar1] & 0xfffffffff | uVar10 << 0x24);
    if (pDVar7->nNodes0Max + 4 <= (int)uVar11) {
      __assert_fail("(int)pObj->Num < s_DarLib->nNodes0Max + 4",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dar/darLib.c"
                    ,0x331,"void Dar_LibEvalAssignNums(Dar_Man_t *, int, Aig_Obj_t *)");
    }
    pDVar16 = pDVar7->pDatas;
    pDVar16[uVar10].fMffc = '\0';
    pDVar16[uVar10].field_0.pFunc = (Aig_Obj_t *)0x0;
    pDVar16[uVar10].TravId = 0xffff;
    DVar3 = pDVar7->pObjs[SUB84(pDVar2[iVar1],0) & 0xffff];
    uVar12 = (ulong)DVar3 >> 0x24;
    uVar11 = pDVar7->nNodes0Max + 4;
    if ((int)uVar11 <= (int)(DVar3._4_4_ >> 4)) {
      __assert_fail("(int)Dar_LibObj(s_DarLib, pObj->Fan0)->Num < s_DarLib->nNodes0Max + 4",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dar/darLib.c"
                    ,0x338,"void Dar_LibEvalAssignNums(Dar_Man_t *, int, Aig_Obj_t *)");
    }
    DVar3 = pDVar7->pObjs[SUB84(pDVar2[iVar1],0) >> 0x10];
    uVar13 = (ulong)DVar3 >> 0x24;
    if (uVar11 <= DVar3._4_4_ >> 4) break;
    pDVar16 = pDVar16 + uVar10;
    pDVar4 = pDVar7->pDatas;
    iVar14 = pDVar4[uVar13].Level;
    if (pDVar4[uVar13].Level < pDVar4[uVar12].Level) {
      iVar14 = pDVar4[uVar12].Level;
    }
    pDVar16->Level = iVar14 + 1;
    pAVar9 = pDVar4[uVar12].field_0.pFunc;
    if ((((pAVar9 != (Aig_Obj_t *)0x0) &&
         (pAVar5 = pDVar4[uVar13].field_0.pFunc, pAVar5 != (Aig_Obj_t *)0x0)) &&
        ((Aig_Obj_t *)((ulong)pAVar9 & 0xfffffffffffffffe) != pRoot)) &&
       ((Aig_Obj_t *)((ulong)pAVar5 & 0xfffffffffffffffe) != pRoot)) {
      pAVar9 = Aig_TableLookupTwo(p->pAig,(Aig_Obj_t *)
                                          ((ulong)(SUB84(pDVar2[iVar1],4) & 1) ^ (ulong)pAVar9),
                                  (Aig_Obj_t *)
                                  ((ulong)(SUB84(pDVar2[iVar1],4) >> 1 & 1) ^ (ulong)pAVar5));
      (pDVar16->field_0).pFunc = pAVar9;
      if (pAVar9 != (Aig_Obj_t *)0x0) {
        uVar10 = (ulong)pAVar9 & 0xfffffffffffffffe;
        pDVar16->Level = *(uint *)(uVar10 + 0x1c) & 0xffffff;
        pAVar6 = p->pAig;
        pDVar16->fMffc = *(int *)(uVar10 + 0x20) == pAVar6->nTravIds;
        if (p->pPars->fPower != 0) {
          fVar8 = (float)Vec_IntEntry(pAVar6->vProbs,*(int *)(uVar10 + 0x24));
          if (((ulong)pDVar16->field_0 & 1) != 0) {
            fVar8 = 1.0 - fVar8;
          }
          pDVar16->dProb = fVar8;
        }
      }
    }
    lVar15 = lVar15 + 1;
  }
  __assert_fail("(int)Dar_LibObj(s_DarLib, pObj->Fan1)->Num < s_DarLib->nNodes0Max + 4",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dar/darLib.c"
                ,0x339,"void Dar_LibEvalAssignNums(Dar_Man_t *, int, Aig_Obj_t *)");
}

Assistant:

void Dar_LibEvalAssignNums( Dar_Man_t * p, int Class, Aig_Obj_t * pRoot )
{
    Dar_LibObj_t * pObj;
    Dar_LibDat_t * pData, * pData0, * pData1;
    Aig_Obj_t * pFanin0, * pFanin1;
    int i;
    for ( i = 0; i < s_DarLib->nNodes0[Class]; i++ )
    {
        // get one class node, assign its temporary number and set its data
        pObj = Dar_LibObj(s_DarLib, s_DarLib->pNodes0[Class][i]);
        pObj->Num = 4 + i;
        assert( (int)pObj->Num < s_DarLib->nNodes0Max + 4 );
        pData = s_DarLib->pDatas + pObj->Num;
        pData->fMffc = 0;
        pData->pFunc = NULL;
        pData->TravId = 0xFFFF;

        // explore the fanins
        assert( (int)Dar_LibObj(s_DarLib, pObj->Fan0)->Num < s_DarLib->nNodes0Max + 4 );
        assert( (int)Dar_LibObj(s_DarLib, pObj->Fan1)->Num < s_DarLib->nNodes0Max + 4 );
        pData0 = s_DarLib->pDatas + Dar_LibObj(s_DarLib, pObj->Fan0)->Num;
        pData1 = s_DarLib->pDatas + Dar_LibObj(s_DarLib, pObj->Fan1)->Num;
        pData->Level = 1 + Abc_MaxInt(pData0->Level, pData1->Level);
        if ( pData0->pFunc == NULL || pData1->pFunc == NULL )
            continue;
        pFanin0 = Aig_NotCond( pData0->pFunc, pObj->fCompl0 );
        pFanin1 = Aig_NotCond( pData1->pFunc, pObj->fCompl1 );
        if ( Aig_Regular(pFanin0) == pRoot || Aig_Regular(pFanin1) == pRoot )
            continue;
        pData->pFunc = Aig_TableLookupTwo( p->pAig, pFanin0, pFanin1 );
        if ( pData->pFunc )
        {
            // update the level to be more accurate
            pData->Level = Aig_Regular(pData->pFunc)->Level;
            // mark the node if it is part of MFFC
            pData->fMffc = Aig_ObjIsTravIdCurrent(p->pAig, Aig_Regular(pData->pFunc));
            // assign the probability
            if ( p->pPars->fPower )
            {
                float Prob = Abc_Int2Float( Vec_IntEntry( p->pAig->vProbs, Aig_ObjId(Aig_Regular(pData->pFunc)) ) );
                pData->dProb = Aig_IsComplement(pData->pFunc)? 1.0-Prob : Prob;
            }
        }
    }
}